

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Op.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::StringOp::StringOp(StringOp *this,opType type,XMLCh *literal,MemoryManager *manager)

{
  XMLCh *pXVar1;
  MemoryManager *manager_local;
  XMLCh *literal_local;
  opType type_local;
  StringOp *this_local;
  
  Op::Op(&this->super_Op,type,manager);
  (this->super_Op)._vptr_Op = (_func_int **)&PTR__StringOp_00525480;
  pXVar1 = XMLString::replicate(literal,manager);
  this->fLiteral = pXVar1;
  return;
}

Assistant:

StringOp::StringOp(const Op::opType type, const XMLCh* const literal
                   , MemoryManager* const manager)
    : Op (type, manager)
      , fLiteral(XMLString::replicate(literal, manager)) {

}